

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O1

int ON_RowReduce(int row_count,int col_count,double zero_pivot,double **A,double **B,double *pivots)

{
  ulong uVar1;
  double dVar2;
  double *pdVar3;
  double *pdVar4;
  double dVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  double dVar18;
  double dVar19;
  double local_78;
  
  uVar14 = (ulong)(uint)row_count;
  if (pivots != (double *)0x0) {
    *pivots = 0.0;
    pivots[1] = 0.0;
  }
  if ((zero_pivot <= 0.0) || (bVar6 = ON_IsValid(zero_pivot), !bVar6)) {
    zero_pivot = 0.0;
  }
  if (0 < row_count) {
    uVar15 = 0;
    do {
      memset(B[uVar15],0,(long)col_count * 8);
      if ((long)uVar15 < (long)col_count) {
        B[uVar15][uVar15] = 1.0;
      }
      uVar15 = uVar15 + 1;
    } while (uVar14 != uVar15);
  }
  dVar18 = **A;
  bVar6 = 0 < row_count;
  local_78 = dVar18;
  if (row_count < 1) {
    uVar15 = 0;
  }
  else {
    uVar16 = 1;
    lVar11 = 0;
    uVar9 = 0;
    iVar17 = col_count;
    do {
      dVar2 = A[uVar9][uVar9];
      dVar19 = ABS(dVar2);
      dVar5 = dVar19;
      if ((dVar18 <= dVar19) && (dVar5 = dVar18, local_78 < dVar19)) {
        local_78 = dVar19;
      }
      dVar18 = dVar5;
      if ((dVar2 != 1.0) || (NAN(dVar2))) {
        uVar15 = uVar9;
        if ((dVar19 <= zero_pivot) || (bVar7 = ON_IsValid(dVar2), !bVar7)) break;
        if (~(uint)uVar9 + col_count != 0) {
          pdVar3 = A[uVar9];
          lVar10 = 1;
          do {
            *(double *)((long)pdVar3 + lVar10 * 8 + lVar11) =
                 *(double *)((long)pdVar3 + lVar10 * 8 + lVar11) * (1.0 / dVar2);
            lVar10 = lVar10 + 1;
          } while (iVar17 != (int)lVar10);
        }
        pdVar3 = B[uVar9];
        lVar10 = 0;
        do {
          pdVar3[lVar10] = pdVar3[lVar10] * (1.0 / dVar2);
          lVar10 = lVar10 + 1;
        } while ((int)uVar16 != (int)lVar10);
      }
      uVar1 = uVar9 + 1;
      if (uVar1 < uVar14) {
        uVar15 = uVar16;
        do {
          pdVar3 = A[uVar15];
          dVar2 = pdVar3[uVar9];
          if ((dVar2 != 0.0) || (NAN(dVar2))) {
            if (col_count != (int)uVar1) {
              pdVar4 = A[uVar9];
              lVar10 = 1;
              do {
                *(double *)((long)pdVar3 + lVar10 * 8 + lVar11) =
                     *(double *)((long)pdVar4 + lVar10 * 8 + lVar11) * -dVar2 +
                     *(double *)((long)pdVar3 + lVar10 * 8 + lVar11);
                lVar10 = lVar10 + 1;
              } while (iVar17 != (int)lVar10);
            }
            pdVar3 = B[uVar9];
            pdVar4 = B[uVar15];
            uVar13 = 0;
            do {
              pdVar4[uVar13] = pdVar3[uVar13] * -dVar2 + pdVar4[uVar13];
              uVar13 = uVar13 + 1;
            } while (uVar16 != uVar13);
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar14);
      }
      bVar6 = uVar1 < uVar14;
      uVar16 = uVar16 + 1;
      lVar11 = lVar11 + 8;
      iVar17 = iVar17 + -1;
      uVar9 = uVar1;
      uVar15 = uVar14;
    } while (uVar1 != uVar14);
  }
  if (pivots != (double *)0x0) {
    *pivots = dVar18;
    pivots[1] = local_78;
  }
  iVar17 = (int)uVar15;
  if ((!bVar6) && (iVar17 = row_count, 0 < row_count)) {
    uVar8 = row_count - 2;
    uVar14 = (ulong)(uint)row_count;
    do {
      uVar15 = uVar14 - 1;
      if (1 < (long)uVar14) {
        uVar9 = (ulong)uVar8;
        do {
          dVar18 = A[uVar9][uVar15];
          if (((dVar18 != 0.0) || (NAN(dVar18))) && (col_count != 0)) {
            pdVar3 = B[uVar9];
            pdVar4 = B[uVar15];
            lVar11 = 0;
            do {
              pdVar3[lVar11] = pdVar4[lVar11] * -dVar18 + pdVar3[lVar11];
              lVar11 = lVar11 + 1;
            } while (col_count != (int)lVar11);
          }
          iVar12 = (int)uVar9;
          uVar9 = uVar9 - 1;
        } while (0 < iVar12);
      }
      uVar8 = uVar8 - 1;
      bVar6 = 1 < (long)uVar14;
      uVar14 = uVar15;
    } while (bVar6);
  }
  return iVar17;
}

Assistant:

int ON_RowReduce( int row_count, 
                  int col_count,
                  double zero_pivot,
                  double** A, 
                  double** B, 
                  double pivots[2] 
                 )
{
  // returned A is identity, B = inverse of input A
  const int M = row_count;
  const int N = col_count;
  const size_t sizeof_row = N*sizeof(A[0][0]);
  int i, j, ii;
  double a, p, p0, p1;
  const double* ptr0;
  double* ptr1;

  if ( pivots )
  {
    pivots[0] = 0.0;
    pivots[1] = 0.0;
  }

  if ( zero_pivot <= 0.0 || !ON_IsValid(zero_pivot) )
    zero_pivot = 0.0;


  for ( i = 0; i < M; i++ )
  {
    memset(B[i],0,sizeof_row);
    if ( i < N )
      B[i][i] = 1.0;
  }

  p0 = p1 = A[0][0];

  for ( i = 0; i < M; i++ )
  {
    p = fabs(a = A[i][i]);
    if ( p < p0 ) p0 = p; else if (p > p1) p1 = p;
    if ( 1.0 != a )
    {
      if ( p <= zero_pivot || !ON_IsValid(a) )
      {
        break;
      }
      a = 1.0/a;

      //A[i][i] = 1.0; // no need to do this

      // The "ptr" voodoo is faster but does the same thing as
      //
      //for ( j = i+1; j < N; j++ )
      //  A[i][j] *= a;
      //      
      j = i+1;
      ptr1 = A[i] + j;
      j = N - j;
      while(j--) *ptr1++ *= a;
      
      // The "ptr" voodoo is faster but does the same thing as
      //
      //for ( j = 0; j <= i; j++ )
      //  B[i][j] *= a;
      //            
      ptr1 = B[i];
      j = i+1;
      while(j--) *ptr1++ *= a;
    }

    for ( ii = i+1; ii < M; ii++ )
    {
      a = A[ii][i];
      if ( 0.0 == a )
        continue;
      a = -a;
      
      //A[ii][i] = 0.0;  // no need to do this

      // The "ptr" voodoo is faster but does the same thing as
      //
      //for( j = i+1; j < N; j++ )
      //  A[ii][j] += a*A[i][j];
      //
      j = i+1;
      ptr0 = A[i] + j;
      ptr1 = A[ii] + j;
      j = N - j;
      while(j--) *ptr1++ += a* *ptr0++;

      for( j = 0; j <= i; j++ )
        B[ii][j] += a*B[i][j];
    }
  }

  if ( pivots )
  {
    pivots[0] = p0;
    pivots[1] = p1;
  }

  if ( i < M )
  {
    return i;
  }


  // A is now upper triangular with all 1s on diagonal 
  //   (That is, if the lines that say "no need to do this" are used.)
  // B is lower triangular with a nonzero diagonal
  for ( i = M-1; i >= 0; i-- )
  {
    for ( ii = i-1; ii >= 0; ii-- )
    {
      a = A[ii][i];
      if ( 0.0 == a )
        continue;
      a = -a;
      //A[ii][i] = 0.0; // no need to do this

      // The "ptr" voodoo is faster but does the same thing as
      //
      //for( j = 0; j < N; j++ )
      //  B[ii][j] += a*B[i][j];
      //
      ptr0 = B[i];
      ptr1 = B[ii];
      j = N;
      while(j--) *ptr1++ += a* *ptr0++;
    }
  }

  // At this point, A is trash.
  // If the input A was really nice (positive definite....)
  // the B = inverse of the input A.  If A was not nice,
  // B is also trash.
  return M;
}